

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O1

MMDB_entry_data_list_s * test_double_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x51,(pMVar1->entry_data).type,"==",3,"\'double\' key\'s value is a double",0);
  compare_double((pMVar1->entry_data).field_1.double_value,42.123456);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_double_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *value = entry_data_list = entry_data_list->next;

    cmp_ok(value->entry_data.type,
           "==",
           MMDB_DATA_TYPE_DOUBLE,
           "'double' key's value is a double");

    compare_double(value->entry_data.double_value, 42.123456);

    return entry_data_list;
}